

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O0

void __thiscall
despot::SemiChainBelief::SemiChainBelief
          (SemiChainBelief *this,DSPOMDP *model,int num_mdp_states,int num_mdp_actions)

{
  reference this_00;
  allocator<double> local_51;
  value_type local_50;
  vector<double,_std::allocator<double>_> local_48;
  int local_30;
  int a;
  int local_20;
  int local_1c;
  int num_mdp_actions_local;
  int num_mdp_states_local;
  DSPOMDP *model_local;
  SemiChainBelief *this_local;
  
  local_20 = num_mdp_actions;
  local_1c = num_mdp_states;
  _num_mdp_actions_local = model;
  model_local = (DSPOMDP *)this;
  despot::Belief::Belief(&this->super_Belief,model);
  *(undefined ***)this = &PTR__SemiChainBelief_0012aa90;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->alpha_);
  this->cur_state_ = 0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&this->alpha_,(long)local_20);
  for (local_30 = 0; local_30 < local_20; local_30 = local_30 + 1) {
    local_50 = 1.0;
    std::allocator<double>::allocator(&local_51);
    std::vector<double,_std::allocator<double>_>::vector(&local_48,2,&local_50,&local_51);
    this_00 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[](&this->alpha_,(long)local_30);
    std::vector<double,_std::allocator<double>_>::operator=(this_00,&local_48);
    std::vector<double,_std::allocator<double>_>::~vector(&local_48);
    std::allocator<double>::~allocator(&local_51);
  }
  return;
}

Assistant:

SemiChainBelief::SemiChainBelief(const DSPOMDP* model, int num_mdp_states,
	int num_mdp_actions) :
	Belief(model),
	cur_state_(0) {
	alpha_.resize(num_mdp_actions);
	for (int a = 0; a < num_mdp_actions; a++) {
		alpha_[a] = vector<double>(2, 1.0);
	}
}